

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::Orthographic(Float zNear,Float zFar)

{
  Transform *in_RDI;
  Transform *this;
  Transform *in_stack_ffffffffffffff68;
  Transform *in_stack_ffffffffffffff70;
  Vector3f *in_stack_ffffffffffffffa0;
  Float in_stack_ffffffffffffffac;
  Float in_stack_ffffffffffffffb0;
  Float in_stack_ffffffffffffffb4;
  
  this = in_RDI;
  Scale(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  Vector3<float>::Vector3((Vector3<float> *)this,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0)
  ;
  Translate(in_stack_ffffffffffffffa0);
  Transform::operator*(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return this;
}

Assistant:

Transform Orthographic(Float zNear, Float zFar) {
    return Scale(1, 1, 1 / (zFar - zNear)) * Translate(Vector3f(0, 0, -zNear));
}